

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextAutomata.h
# Opt level: O1

uint __thiscall
bwtil::ContextAutomata::optimalK
          (ContextAutomata *this,uint overhead,BackwardIterator *bfr,bool verbose)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  uint uVar6;
  time_t tVar7;
  ostream *poVar8;
  pointer puVar9;
  ulint uVar10;
  ulint uVar11;
  undefined4 uVar12;
  undefined7 in_register_00000009;
  undefined8 uVar13;
  undefined4 uVar14;
  uint i;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulint uVar18;
  uint uVar19;
  ulong uVar20;
  size_t sVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 in_ZMM1 [64];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampled_text;
  PartialSums sample_cumulative_counter;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> sample_dynstring;
  allocator_type local_169;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  double local_148;
  double local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  long local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  value_type local_e8;
  PartialSums local_e0;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> local_b8;
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar24 [64];
  undefined1 extraout_var_00 [56];
  
  auVar23 = in_ZMM1._0_16_;
  uVar20 = 1000;
  if (this->n < 1000) {
    uVar20 = this->n;
  }
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  uVar13 = CONCAT71(in_register_00000009,verbose);
  tVar7 = time((time_t *)0x0);
  uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
  srand((uint)tVar7);
  uVar2 = this->n;
  auVar3 = vcvtusi2sd_avx512f(auVar23,uVar2);
  auVar22._0_8_ = log2(auVar3._0_8_);
  auVar22._8_56_ = extraout_var;
  uVar12 = vcvttsd2usi_avx512f(auVar22._0_16_);
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Sampling text ... ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    auVar24._8_56_ = extraout_var_00;
    auVar24._0_8_ = extraout_XMM1_Qa;
    auVar23 = auVar24._0_16_;
  }
  auVar3 = vcvtusi2sd_avx512f(auVar23,(uVar2 / CONCAT44(uVar14,uVar12)) / uVar20);
  auVar23 = vcvtusi2sd_avx512f(auVar23,uVar2 / uVar20);
  local_148 = auVar3._0_8_ / auVar23._0_8_;
  uVar18 = this->n;
  iVar17 = -1;
  while (iVar4 = (*bfr->_vptr_BackwardIterator[4])(bfr), (char)iVar4 == '\0') {
    if ((this->n - uVar18) % uVar20 == 0) {
      if ((uVar20 <= uVar18) &&
         ((this->n == uVar18 || (iVar4 = rand(), (double)iVar4 * 4.656612875245797e-10 <= local_148)
          ))) {
        uVar15 = 0;
        do {
          iVar4 = (*bfr->_vptr_BackwardIterator[3])(bfr);
          local_b8.number_of_internal_nodes = (symbol)iVar4;
          if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      (&local_168,
                       (iterator)
                       local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_b8.number_of_internal_nodes)
            ;
          }
          else {
            *local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish = local_b8.number_of_internal_nodes;
            local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < (uint)uVar20);
      }
      iVar4 = (int)(((this->n - uVar18) * 100) / this->n);
      if ((iVar17 < iVar4 && verbose) && (uint)(iVar4 * -0x33333333) < 0x33333334) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"% done.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar17 = iVar4;
      }
    }
    uVar18 = uVar18 - 1;
    (*bfr->_vptr_BackwardIterator[3])(bfr);
  }
  (*bfr->_vptr_BackwardIterator[2])(bfr);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n  Sampled text size = ",0x17);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  PartialSums::PartialSums(&local_e0,this->sigma,this->n);
  local_e8 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_100,(ulong)this->sigma,&local_e8,&local_169);
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::DynamicString
            (&local_b8,&local_100);
  if (local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  uVar18 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::bitSize(&local_b8);
  local_148 = (double)(uVar18 + 0x1a0 + (ulong)local_e0.nr_of_nodes * 0x40);
  local_120 = (ulong)(this->sigma << 3) * 4 + 0xc0;
  auVar23._8_8_ = in_XMM2_Qb;
  auVar23._0_8_ = in_XMM2_Qa;
  auVar23 = vcvtusi2sd_avx512f(auVar23,this->n + 1);
  local_140 = log2(auVar23._0_8_);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Extimated number of bits per k-mer: ",0x26);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Extimated number of bits per (k-1)-mer: ",0x2a);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
  }
  uVar20 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar20 == 0) {
    puVar9 = (pointer)0x0;
  }
  else {
    if ((long)uVar20 < 0) {
LAB_00111532:
      std::__throw_bad_alloc();
    }
    puVar9 = (pointer)operator_new(uVar20);
  }
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar9 + uVar20;
  sVar21 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar9;
  if (sVar21 != 0) {
    local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar9;
    memmove(puVar9,local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar21);
  }
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar9 + sVar21;
  uVar18 = numberOfContexts(this,1,&local_118);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Number of ",0xc);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-mers : ",8);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_140;
  uVar5 = vcvttsd2usi_avx512f(auVar3);
  uVar15 = 1;
  if (1 < uVar5) {
    local_140 = (double)(ulong)overhead;
    uVar19 = 1;
    lVar16 = 2;
    uVar10 = 1;
    do {
      uVar15 = uVar19;
      if ((this->n * (long)local_140) / 100 < uVar10 * local_120 + uVar18 * (long)local_148) break;
      uVar20 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (uVar20 == 0) {
        puVar9 = (pointer)0x0;
      }
      else {
        if ((long)uVar20 < 0) goto LAB_00111532;
        puVar9 = (pointer)operator_new(uVar20);
      }
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar9 + uVar20;
      sVar21 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar9;
      if (sVar21 != 0) {
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar9;
        memmove(puVar9,local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,sVar21);
      }
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar9 + sVar21;
      uVar11 = numberOfContexts(this,(uint)lVar16,&local_138);
      if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Number of ",0xc)
        ;
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-mers : ",8);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      uVar19 = uVar19 + 1;
      lVar1 = (2 - (ulong)uVar5) + lVar16;
      lVar16 = lVar16 + 1;
      uVar10 = uVar18;
      uVar18 = uVar11;
      uVar15 = uVar5;
    } while (lVar1 != 2);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_b8.codes);
  std::
  vector<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::~vector(&local_b8.wavelet_tree);
  if (local_b8.child1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.child1.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b8.child0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.child0.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.nodes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.nodes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  uVar6 = 1;
  if (1 < uVar15) {
    uVar6 = uVar15 - 1;
  }
  return uVar6;
}

Assistant:

uint optimalK(uint overhead, BackwardIterator * bfr, bool verbose){

		//strategy: sample randomly n/log n characters of the text (in contiguous blocks of size B)
		//and try k=1,... until suitable k is found. There will be at most log_sigma n iterations, so work is linear.

		ulint B = 1000; //number of characters per block

		if(n<B)
			B = n;

		vector<symbol> sampled_text;

		srand(time(NULL));

		ulint nr_of_blocks = n/B;//total number of blocks in the text
		ulint sampled_n = n/(uint)log2(n);//expected size of sampled text
		ulint nr_of_sampled_blocks = sampled_n/B;//expected number of sampled blocks
		double p = (double)nr_of_sampled_blocks/(double)nr_of_blocks;//probability that a block is sampled

		int perc,last_perc=-1;
		if(verbose)
			cout << "  Sampling text ... " << endl;

		ulint pos = n-1;//current position in the text
		while(not bfr->begin()){

			if(((n-1)-pos)%B==0){

				if(pos+1 >= B ){//if there are at least B characters to be sampled

					if((n-1)-pos==0 or flip_coin(p)){//randomly decide if sample the block

						for(uint i=0;i<B;i++)	//sample B characters
							sampled_text.push_back( bfr->read() );

					}

				}

				perc = (100*((n-1)-pos))/n;

				if(perc>last_perc and (perc%5)==0 and verbose){
					cout << "  " << perc << "% done." << endl;
					last_perc=perc;
				}

			}

			bfr->read();//skip character on text
			pos--;

		}

		bfr->rewind();

		if(verbose)
			cout << "\n  Sampled text size = " << sampled_text.size() << endl;

		/*
		 * Extimate number of bits in memory for each context:
		 * O(sigma * log n) bits for each context.
		 *
		 * Structures in memory:
		 *
		 * vector<uint > prefix_nr;
		 * vector<vector<uint> > edges;
		 * CumulativeCounters * counters;
		 * DynamicString ** dynStrings;
		 * ulint * lengths;
		 *
		 */

		PartialSums sample_cumulative_counter = PartialSums(sigma,n);//sample of cumulative counter to extimate its memory consumption
		DynamicString<bitv> sample_dynstring = DynamicString<bitv>(vector<ulint>(sigma,1));

		ulint bits_per_k_mer =
				CHAR_BIT * sizeof(DynamicString<bitv> *) + //pointers to DynamicStrings
				sample_cumulative_counter.bitSize()  + //cumulative counters
				sample_dynstring.bitSize() + //DynamicStrings
				CHAR_BIT*sizeof(vector<uint >) + //vector prefix_nr
				CHAR_BIT*sizeof(uint) + //content of vector prefix_nr
				CHAR_BIT*sizeof(ulint); //lengths

		ulint bits_per_k_1_mer =
				CHAR_BIT*sizeof(vector<uint>) + //vector edges
				CHAR_BIT*sigma*sizeof(uint); //content of vector edges

		uint log_n = log2(n+1);

		if(verbose) cout << "  Extimated number of bits per k-mer: " << bits_per_k_mer << endl;
		if(verbose) cout << "  Extimated number of bits per (k-1)-mer: " << bits_per_k_1_mer << endl;

		ulint nr_of_k_mers;
		ulint nr_of_k_1_mers=1;//number of (k-1)-mers

		// we want the highest k such that nr_of_contexts*bits_per_context <= n * (overhead/100)

		uint _k = 1;//start from k=1.
		nr_of_k_mers=numberOfContexts( _k, sampled_text);

		if(verbose) cout << "  Number of " << _k << "-mers : " << nr_of_k_mers << endl;

		while( _k < log_n and (nr_of_k_mers * bits_per_k_mer + nr_of_k_1_mers * bits_per_k_1_mer <= (n * overhead)/100) ){

			_k++;

			nr_of_k_1_mers = nr_of_k_mers;
			nr_of_k_mers=numberOfContexts( _k, sampled_text);

			if(verbose) cout << "  Number of " << _k << "-mers : " << nr_of_k_mers << endl;

		}

		if(_k > 1)//we found the first _k above the threshold, so decrease _k.
			_k--;
		else
			_k = 1;//minimum k is 1

		return _k;

	}